

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::byteSwap(APInt *this)

{
  bool bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint64_t uVar5;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t extraout_RDX_01;
  uint64_t extraout_RDX_02;
  uint64_t extraout_RDX_03;
  uint64_t extraout_RDX_04;
  APInt *in_RSI;
  APInt AVar6;
  uint local_24;
  uint N;
  uint I;
  uint16_t Tmp2;
  uint Tmp1;
  APInt *this_local;
  APInt *Result;
  
  bVar1 = false;
  if ((0xf < in_RSI->BitWidth) && (bVar1 = false, (in_RSI->BitWidth & 0xf) == 0)) {
    bVar1 = true;
  }
  if (!bVar1) {
    __assert_fail("BitWidth >= 16 && BitWidth % 16 == 0 && \"Cannot byteswap!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x269,"APInt llvm::APInt::byteSwap() const");
  }
  if (in_RSI->BitWidth == 0x10) {
    uVar4 = in_RSI->BitWidth;
    uVar2 = ByteSwap_16((uint16_t)(in_RSI->U).VAL);
    APInt(this,uVar4,(ulong)uVar2,false);
    uVar5 = extraout_RDX;
  }
  else if (in_RSI->BitWidth == 0x20) {
    uVar4 = in_RSI->BitWidth;
    uVar3 = ByteSwap_32((uint32_t)(in_RSI->U).VAL);
    APInt(this,uVar4,(ulong)uVar3,false);
    uVar5 = extraout_RDX_00;
  }
  else if (in_RSI->BitWidth == 0x30) {
    uVar3 = ByteSwap_32((uint32_t)((in_RSI->U).VAL >> 0x10));
    uVar2 = ByteSwap_16((uint16_t)(in_RSI->U).VAL);
    APInt(this,in_RSI->BitWidth,(ulong)CONCAT24(uVar2,uVar3),false);
    uVar5 = extraout_RDX_01;
  }
  else if (in_RSI->BitWidth == 0x40) {
    uVar4 = in_RSI->BitWidth;
    uVar5 = ByteSwap_64((in_RSI->U).VAL);
    APInt(this,uVar4,uVar5,false);
    uVar5 = extraout_RDX_02;
  }
  else {
    uVar4 = getNumWords(in_RSI);
    APInt(this,uVar4 << 6,0,false);
    local_24 = 0;
    uVar4 = getNumWords(in_RSI);
    uVar5 = extraout_RDX_03;
    for (; local_24 != uVar4; local_24 = local_24 + 1) {
      uVar5 = ByteSwap_64((in_RSI->U).pVal[(uVar4 - local_24) - 1]);
      (this->U).pVal[local_24] = uVar5;
    }
    if (this->BitWidth != in_RSI->BitWidth) {
      lshrInPlace(this,this->BitWidth - in_RSI->BitWidth);
      this->BitWidth = in_RSI->BitWidth;
      uVar5 = extraout_RDX_04;
    }
  }
  AVar6._8_8_ = uVar5;
  AVar6.U.pVal = (uint64_t *)this;
  return AVar6;
}

Assistant:

APInt APInt::byteSwap() const {
  assert(BitWidth >= 16 && BitWidth % 16 == 0 && "Cannot byteswap!");
  if (BitWidth == 16)
    return APInt(BitWidth, ByteSwap_16(uint16_t(U.VAL)));
  if (BitWidth == 32)
    return APInt(BitWidth, ByteSwap_32(unsigned(U.VAL)));
  if (BitWidth == 48) {
    unsigned Tmp1 = unsigned(U.VAL >> 16);
    Tmp1 = ByteSwap_32(Tmp1);
    uint16_t Tmp2 = uint16_t(U.VAL);
    Tmp2 = ByteSwap_16(Tmp2);
    return APInt(BitWidth, (uint64_t(Tmp2) << 32) | Tmp1);
  }
  if (BitWidth == 64)
    return APInt(BitWidth, ByteSwap_64(U.VAL));

  APInt Result(getNumWords() * APINT_BITS_PER_WORD, 0);
  for (unsigned I = 0, N = getNumWords(); I != N; ++I)
    Result.U.pVal[I] = ByteSwap_64(U.pVal[N - I - 1]);
  if (Result.BitWidth != BitWidth) {
    Result.lshrInPlace(Result.BitWidth - BitWidth);
    Result.BitWidth = BitWidth;
  }
  return Result;
}